

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_slot_allocator_free(ma_slot_allocator *pAllocator,ma_uint64 slot)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ma_uint32 newBitfield;
  ma_uint32 oldBitfield;
  ma_uint32 iBit;
  ma_uint32 iGroup;
  ma_uint64 slot_local;
  ma_slot_allocator *pAllocator_local;
  ma_result local_2c;
  uint local_14;
  ma_uint32 cap;
  
  if (pAllocator == (ma_slot_allocator *)0x0) {
    local_2c = MA_INVALID_ARGS;
  }
  else {
    uVar3 = (slot & 0xffffffff) >> 5;
    cap = pAllocator->capacity >> 5;
    if ((pAllocator->capacity & 0x1f) != 0) {
      cap = cap + 1;
    }
    if ((uint)uVar3 < cap) {
      do {
        if (pAllocator->count == 0) {
          return MA_INVALID_OPERATION;
        }
        uVar1 = pAllocator->pGroups[uVar3].bitfield;
        LOCK();
        uVar2 = pAllocator->pGroups[uVar3].bitfield;
        bVar4 = uVar1 == uVar2;
        if (bVar4) {
          pAllocator->pGroups[uVar3].bitfield = uVar1 & ~(1 << ((uint)slot & 0x1f));
          uVar2 = uVar1;
        }
        UNLOCK();
        local_14 = uVar1;
        if (!bVar4) {
          local_14 = uVar2;
        }
      } while (local_14 != uVar1);
      LOCK();
      pAllocator->count = pAllocator->count - 1;
      UNLOCK();
      local_2c = MA_SUCCESS;
    }
    else {
      local_2c = MA_INVALID_ARGS;
    }
  }
  return local_2c;
}

Assistant:

MA_API ma_result ma_slot_allocator_free(ma_slot_allocator* pAllocator, ma_uint64 slot)
{
    ma_uint32 iGroup;
    ma_uint32 iBit;

    if (pAllocator == NULL) {
        return MA_INVALID_ARGS;
    }

    iGroup = (ma_uint32)((slot & 0xFFFFFFFF) >> 5);   /* slot / 32 */
    iBit   = (ma_uint32)((slot & 0xFFFFFFFF) & 31);   /* slot % 32 */

    if (iGroup >= ma_slot_allocator_group_capacity(pAllocator)) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(iBit < 32);   /* This must be true due to the logic we used to actually calculate it. */

    while (ma_atomic_load_32(&pAllocator->count) > 0) {
        /* CAS */
        ma_uint32 oldBitfield;
        ma_uint32 newBitfield;

        oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */
        newBitfield = oldBitfield & ~(1 << iBit);

        /* Debugging for checking for double-frees. */
        #if defined(MA_DEBUG_OUTPUT)
        {
            if ((oldBitfield & (1 << iBit)) == 0) {
                MA_ASSERT(MA_FALSE);    /* Double free detected.*/
            }
        }
        #endif

        if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
            ma_atomic_fetch_sub_32(&pAllocator->count, 1);
            return MA_SUCCESS;
        }
    }

    /* Getting here means there are no allocations available for freeing. */
    return MA_INVALID_OPERATION;
}